

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolve.cpp
# Opt level: O0

HighsStatus solveLp(HighsLpSolverObject *solver_object,string *message)

{
  size_type sVar1;
  __type _Var2;
  bool bVar3;
  HighsInt HVar4;
  HighsDebugStatus HVar5;
  char *pcVar6;
  undefined8 uVar7;
  char *pcVar8;
  HighsSolution *solution;
  HighsSolution *in_RSI;
  HighsOptions *in_RDI;
  double dVar9;
  HighsInfo *info;
  bool allow_simplex_cleanup;
  bool unwelcome_ipx_status;
  exception *exception_1;
  exception *exception;
  HighsOptions *options;
  HighsStatus call_status;
  HighsStatus return_status;
  HighsSparseMatrix *in_stack_fffffffffffffb18;
  HighsLp *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  HighsLp *in_stack_fffffffffffffb40;
  allocator *paVar10;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  byte bVar11;
  undefined8 in_stack_fffffffffffffb68;
  HighsSolution *pHVar12;
  HighsLogOptions *in_stack_fffffffffffffb70;
  HighsLogOptions *log_options_;
  byte local_46e;
  byte local_46d;
  HighsLpSolverObject *in_stack_fffffffffffffbc8;
  HighsStatus in_stack_fffffffffffffbd0;
  HighsStatus in_stack_fffffffffffffbd4;
  HighsModelStatus in_stack_fffffffffffffbec;
  HighsStatus in_stack_fffffffffffffbf0;
  HighsModelStatus in_stack_fffffffffffffbf4;
  HighsBasis *in_stack_fffffffffffffbf8;
  HighsLp *lp;
  HighsOptions *options_00;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [32];
  HighsLpSolverObject *in_stack_fffffffffffffc60;
  allocator local_331;
  string local_330 [135];
  byte local_2a9;
  string local_2a8 [38];
  byte local_282;
  allocator local_281;
  string local_280 [40];
  HighsLpSolverObject *in_stack_fffffffffffffda8;
  allocator local_1f1;
  string local_1f0 [143];
  allocator local_161;
  string local_160 [135];
  HighsBasis local_d9;
  HighsOptions *local_28;
  HighsStatus local_20;
  HighsModelStatus local_1c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_1c = kMin;
  local_28 = (HighsOptions *)(in_RDI->super_HighsOptionsStruct).solver._M_string_length;
  resetModelStatusAndHighsInfo((HighsLpSolverObject *)in_RDI);
  options_00 = (HighsOptions *)&(local_28->super_HighsOptionsStruct).log_options;
  lp = (HighsLp *)&stack0xffffffffffffffb8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 (char *)in_stack_fffffffffffffb40);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  highsLogUser((HighsLogOptions *)options_00,kInfo,pcVar6);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  if (0 < (local_28->super_HighsOptionsStruct).highs_debug_level) {
    local_20 = assessLp((HighsLp *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        in_RDI);
    HighsLogOptions::HighsLogOptions
              ((HighsLogOptions *)in_stack_fffffffffffffb20,
               (HighsLogOptions *)in_stack_fffffffffffffb18);
    in_stack_fffffffffffffbf8 = &local_d9;
    in_stack_fffffffffffffbf0 = local_20;
    in_stack_fffffffffffffbf4 = local_1c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d9.alien,"assessLp",(allocator *)in_stack_fffffffffffffbf8);
    in_stack_fffffffffffffbec =
         interpretCallStatus(in_stack_fffffffffffffb70,
                             (HighsStatus)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                             (HighsStatus)in_stack_fffffffffffffb68,
                             (string *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60)
                            );
    local_1c = in_stack_fffffffffffffbec;
    std::__cxx11::string::~string((string *)&local_d9.alien);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x52bf68);
    if (local_1c == ~kMin) {
      return kError;
    }
  }
  if ((*(int *)((long)(in_RDI->super_HighsOptionsStruct)._vptr_HighsOptionsStruct + 4) == 0) ||
     (HVar4 = HighsSparseMatrix::numNz(in_stack_fffffffffffffb18), HVar4 == 0)) {
    local_20 = solveUnconstrainedLp((HighsLpSolverObject *)0x52c045);
    HighsLogOptions::HighsLogOptions
              ((HighsLogOptions *)in_stack_fffffffffffffb20,
               (HighsLogOptions *)in_stack_fffffffffffffb18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"solveUnconstrainedLp",&local_161);
    in_stack_fffffffffffffbd4 =
         interpretCallStatus(in_stack_fffffffffffffb70,
                             (HighsStatus)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                             (HighsStatus)in_stack_fffffffffffffb68,
                             (string *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60)
                            );
    local_1c = in_stack_fffffffffffffbd4;
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x52c118);
    if (local_1c == kError) {
      return kError;
    }
  }
  else {
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb40,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    if (((_Var2) || (((local_28->super_HighsOptionsStruct).run_centring & 1U) != 0)) ||
       (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb40,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)),
       _Var2)) {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb40,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      if ((_Var2) || (((local_28->super_HighsOptionsStruct).run_centring & 1U) != 0)) {
        in_stack_fffffffffffffbd0 = solveLpIpx((HighsLpSolverObject *)in_stack_fffffffffffffb20);
        local_20 = in_stack_fffffffffffffbd0;
        HighsLogOptions::HighsLogOptions
                  ((HighsLogOptions *)in_stack_fffffffffffffb20,
                   (HighsLogOptions *)in_stack_fffffffffffffb18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,"solveLpIpx",&local_1f1);
        local_1c = interpretCallStatus(in_stack_fffffffffffffb70,
                                       (HighsStatus)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                                       (HighsStatus)in_stack_fffffffffffffb68,
                                       (string *)
                                       CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60)
                                      );
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x52c398);
      }
      else {
        local_20 = solveLpCupdlp((HighsLpSolverObject *)in_stack_fffffffffffffb20);
        HighsLogOptions::HighsLogOptions
                  ((HighsLogOptions *)in_stack_fffffffffffffb20,
                   (HighsLogOptions *)in_stack_fffffffffffffb18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_280,"solveLpCupdlp",&local_281);
        local_1c = interpretCallStatus(in_stack_fffffffffffffb70,
                                       (HighsStatus)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                                       (HighsStatus)in_stack_fffffffffffffb68,
                                       (string *)
                                       CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60)
                                      );
        std::__cxx11::string::~string(local_280);
        std::allocator<char>::~allocator((allocator<char> *)&local_281);
        HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x52c596);
      }
      if (local_1c == kError) {
        return kError;
      }
      correctResiduals(in_stack_fffffffffffffc60);
      dVar9 = HighsLp::objectiveValue
                        (in_stack_fffffffffffffb40,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      *(double *)((in_RDI->super_HighsOptionsStruct).presolve.field_2._M_allocated_capacity + 0x38)
           = dVar9;
      getLpKktFailures(options_00,lp,in_RSI,in_stack_fffffffffffffbf8,
                       (HighsInfo *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      if ((*(int *)((long)&(in_RDI->super_HighsOptionsStruct).solver.field_2 + 8) == 7) &&
         ((0 < *(int *)((in_RDI->super_HighsOptionsStruct).presolve.field_2._M_allocated_capacity +
                       0x58) ||
          (*(int *)((in_RDI->super_HighsOptionsStruct).presolve.field_2._M_allocated_capacity + 0x70
                   ) != 0)))) {
        *(undefined4 *)((long)&(in_RDI->super_HighsOptionsStruct).solver.field_2 + 8) = 0xf;
      }
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb40,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      if ((_Var2) || (((local_28->super_HighsOptionsStruct).run_centring & 1U) != 0)) {
        local_46d = 1;
        if (*(int *)((long)&(in_RDI->super_HighsOptionsStruct).solver.field_2 + 8) != 0xf) {
          local_46e = 0;
          if (*(int *)((long)&(in_RDI->super_HighsOptionsStruct).solver.field_2 + 8) == 9) {
            local_46e = (local_28->super_HighsOptionsStruct).allow_unbounded_or_infeasible ^ 0xff;
          }
          local_46d = local_46e;
        }
        local_282 = local_46d & 1;
        if (local_282 != 0) {
          log_options_ = &(local_28->super_HighsOptionsStruct).log_options;
          utilModelStatusToString_abi_cxx11_(in_stack_fffffffffffffbec);
          uVar7 = std::__cxx11::string::c_str();
          pcVar6 = "not ";
          if ((**(byte **)&(in_RDI->super_HighsOptionsStruct).presolve & 1) != 0) {
            pcVar6 = "";
          }
          pcVar8 = "not ";
          if ((*(byte *)(in_RDI->super_HighsOptionsStruct).presolve._M_string_length & 1) != 0) {
            pcVar8 = "";
          }
          if (((local_28->super_HighsOptionsStruct).run_centring & 1U) == 0) {
            solution = (HighsSolution *)std::__cxx11::string::c_str();
          }
          else {
            solution = (HighsSolution *)std::__cxx11::string::c_str();
          }
          pHVar12 = solution;
          highsLogUser(log_options_,kWarning,
                       "Unwelcome IPX status of %s: basis is %svalid; solution is %svalid; run_crossover is \"%s\"\n"
                       ,uVar7,pcVar6,pcVar8);
          std::__cxx11::string::~string(local_2a8);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffb20,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)solution);
          bVar11 = 0;
          if (bVar3) {
            bVar11 = (local_28->super_HighsOptionsStruct).run_centring ^ 0xff;
          }
          local_2a9 = bVar11 & 1;
          if (local_2a9 != 0) {
            highsLogUser(&(local_28->super_HighsOptionsStruct).log_options,kWarning,
                         "IPX solution is imprecise, so clean up with simplex\n");
            local_1c = 0;
            local_20 = solveLpSimplex(in_stack_fffffffffffffda8);
            HighsLogOptions::HighsLogOptions
                      ((HighsLogOptions *)in_stack_fffffffffffffb20,(HighsLogOptions *)solution);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_330,"solveLpSimplex",&local_331);
            local_1c = interpretCallStatus(log_options_,(HighsStatus)((ulong)pHVar12 >> 0x20),
                                           (HighsStatus)pHVar12,
                                           (string *)CONCAT17(bVar11,in_stack_fffffffffffffb60));
            std::__cxx11::string::~string(local_330);
            std::allocator<char>::~allocator((allocator<char> *)&local_331);
            HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x52c9c9);
            if (local_1c == kError) {
              return kError;
            }
            bVar3 = isSolutionRightSize(in_stack_fffffffffffffb20,solution);
            if (!bVar3) {
              highsLogUser(&(local_28->super_HighsOptionsStruct).log_options,kError,
                           "Inconsistent solution returned from solver\n");
              return kError;
            }
          }
        }
      }
      else {
        sVar1 = (in_RDI->super_HighsOptionsStruct).presolve.field_2._M_allocated_capacity;
        if (*(int *)((long)&(in_RDI->super_HighsOptionsStruct).solver.field_2 + 8) == 7) {
          if ((*(int *)(sVar1 + 0x58) != 0) || (*(int *)(sVar1 + 0x70) != 0)) {
            if (*(int *)(sVar1 + 0x58) == 0) {
              if (*(int *)(sVar1 + 0x70) != 0) {
                highsLogUser(*(HighsLogOptions **)(sVar1 + 0x78),*(HighsLogType *)(sVar1 + 0x80),
                             (char *)&(local_28->super_HighsOptionsStruct).log_options,4,
                             "PDLP claims optimality, but with num/max/sum %d / %9.4g / %9.4g dual infeasibilities\n"
                             ,(ulong)*(uint *)(sVar1 + 0x70));
              }
            }
            else {
              highsLogUser(*(HighsLogOptions **)(sVar1 + 0x60),*(HighsLogType *)(sVar1 + 0x68),
                           (char *)&(local_28->super_HighsOptionsStruct).log_options,4,
                           "PDLP claims optimality, but with num/max/sum %d / %9.4g / %9.4g primal infeasibilities\n"
                           ,(ulong)*(uint *)(sVar1 + 0x58));
            }
            highsLogUser(*(HighsLogOptions **)(sVar1 + 0x88),*(HighsLogType *)(sVar1 + 0x90),
                         (char *)&(local_28->super_HighsOptionsStruct).log_options,4,
                         "                        and          max/sum     %9.4g / %9.4g complementarity violations\n"
                        );
            highsLogUser(&(local_28->super_HighsOptionsStruct).log_options,kWarning,
                         "                        so set model status to \"unknown\"\n");
            *(undefined4 *)((long)&(in_RDI->super_HighsOptionsStruct).solver.field_2 + 8) = 0xf;
          }
        }
        else if ((*(int *)((long)&(in_RDI->super_HighsOptionsStruct).solver.field_2 + 8) == 9) &&
                (*(int *)(sVar1 + 0x58) == 0)) {
          *(undefined4 *)((long)&(in_RDI->super_HighsOptionsStruct).solver.field_2 + 8) = 10;
        }
      }
    }
    else {
      local_20 = solveLpSimplex(in_stack_fffffffffffffda8);
      HighsLogOptions::HighsLogOptions
                ((HighsLogOptions *)in_stack_fffffffffffffb20,
                 (HighsLogOptions *)in_stack_fffffffffffffb18);
      paVar10 = &local_3c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3c0,"solveLpSimplex",paVar10);
      local_1c = interpretCallStatus(in_stack_fffffffffffffb70,
                                     (HighsStatus)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                                     (HighsStatus)in_stack_fffffffffffffb68,
                                     (string *)
                                     CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
      std::__cxx11::string::~string(local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x52cd2b);
      if (local_1c == kError) {
        return kError;
      }
      bVar3 = isSolutionRightSize(in_stack_fffffffffffffb20,
                                  (HighsSolution *)in_stack_fffffffffffffb18);
      if (!bVar3) {
        highsLogUser(&(local_28->super_HighsOptionsStruct).log_options,kError,
                     "Inconsistent solution returned from solver\n");
        return kError;
      }
    }
  }
  std::__cxx11::string::string(local_3e8,(string *)in_RSI);
  HVar5 = debugHighsLpSolution
                    ((string *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                     in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_3e8);
  if (HVar5 == kLogicalError) {
    local_1c = kError;
  }
  return local_1c;
}

Assistant:

HighsStatus solveLp(HighsLpSolverObject& solver_object, const string message) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  HighsOptions& options = solver_object.options_;
  // Reset unscaled model status and solution params - except for
  // iteration counts
  resetModelStatusAndHighsInfo(solver_object);
  highsLogUser(options.log_options, HighsLogType::kInfo,
               (message + "\n").c_str());
  if (options.highs_debug_level > kHighsDebugLevelMin) {
    // Shouldn't have to check validity of the LP since this is done when it is
    // loaded or modified
    call_status = assessLp(solver_object.lp_, options);
    // If any errors have been found or normalisation carried out,
    // call_status will be ERROR or WARNING, so only valid return is OK.
    assert(call_status == HighsStatus::kOk);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "assessLp");
    if (return_status == HighsStatus::kError) return return_status;
  }
  if (!solver_object.lp_.num_row_ || solver_object.lp_.a_matrix_.numNz() == 0) {
    // LP is unconstrained due to having no rows or a zero constraint
    // matrix, so solve directly
    call_status = solveUnconstrainedLp(solver_object);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "solveUnconstrainedLp");
    if (return_status == HighsStatus::kError) return return_status;
  } else if (options.solver == kIpmString || options.run_centring ||
             options.solver == kPdlpString) {
    // Use IPM or PDLP
    if (options.solver == kIpmString || options.run_centring) {
      // Use IPX to solve the LP
      try {
        call_status = solveLpIpx(solver_object);
      } catch (const std::exception& exception) {
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Exception %s in solveLpIpx\n", exception.what());
        call_status = HighsStatus::kError;
      }
      return_status = interpretCallStatus(options.log_options, call_status,
                                          return_status, "solveLpIpx");
    } else {
      // Use cuPDLP-C to solve the LP
      try {
        call_status = solveLpCupdlp(solver_object);
      } catch (const std::exception& exception) {
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Exception %s in solveLpCupdlp\n", exception.what());
        call_status = HighsStatus::kError;
      }
      return_status = interpretCallStatus(options.log_options, call_status,
                                          return_status, "solveLpCupdlp");
    }
    if (return_status == HighsStatus::kError) return return_status;
    // IPM (and PDLP?) can claim optimality with large primal and/or
    // dual residual errors, so must correct any residual errors that
    // exceed the tolerance in this scenario.
    //
    // OK to correct residual errors whatever the model status, as
    // it's only changed in the case of optimality
    correctResiduals(solver_object);

    // Non-error return requires a primal solution
    assert(solver_object.solution_.value_valid);
    // Get the objective and any KKT failures
    solver_object.highs_info_.objective_function_value =
        solver_object.lp_.objectiveValue(solver_object.solution_.col_value);
    getLpKktFailures(options, solver_object.lp_, solver_object.solution_,
                     solver_object.basis_, solver_object.highs_info_);
    if (solver_object.model_status_ == HighsModelStatus::kOptimal &&
        (solver_object.highs_info_.num_primal_infeasibilities > 0 ||
         solver_object.highs_info_.num_dual_infeasibilities))
      solver_object.model_status_ = HighsModelStatus::kUnknown;
    if (options.solver == kIpmString || options.run_centring) {
      // Setting the IPM-specific values of (highs_)info_ has been done in
      // solveLpIpx
      const bool unwelcome_ipx_status =
          solver_object.model_status_ == HighsModelStatus::kUnknown ||
          (solver_object.model_status_ ==
               HighsModelStatus::kUnboundedOrInfeasible &&
           !options.allow_unbounded_or_infeasible);
      if (unwelcome_ipx_status) {
        // When performing an analytic centre calculation, the setting
        // of options.run_crossover is ignored, so simplex clean-up is
        // not possible - or desirable, anyway!
        highsLogUser(
            options.log_options, HighsLogType::kWarning,
            "Unwelcome IPX status of %s: basis is %svalid; solution is "
            "%svalid; run_crossover is \"%s\"\n",
            utilModelStatusToString(solver_object.model_status_).c_str(),
            solver_object.basis_.valid ? "" : "not ",
            solver_object.solution_.value_valid ? "" : "not ",
            options.run_centring ? kHighsOffString.c_str()
                                 : options.run_crossover.c_str());
        const bool allow_simplex_cleanup =
            options.run_crossover != kHighsOffString && !options.run_centring;
        if (allow_simplex_cleanup) {
          // IPX has returned a model status that HiGHS would rather
          // avoid, so perform simplex clean-up if crossover was allowed.
          //
          // This is an unusual situation, and the cost will usually be
          // acceptable. Worst case is if crossover wasn't run, in which
          // case there's no basis to start simplex
          //
          // ToDo: Check whether simplex can exploit the primal solution
          // returned by IPX
          highsLogUser(options.log_options, HighsLogType::kWarning,
                       "IPX solution is imprecise, so clean up with simplex\n");
          // Reset the return status since it will now be determined by
          // the outcome of the simplex solve
          return_status = HighsStatus::kOk;
          call_status = solveLpSimplex(solver_object);
          return_status = interpretCallStatus(options.log_options, call_status,
                                              return_status, "solveLpSimplex");
          if (return_status == HighsStatus::kError) return return_status;
          if (!isSolutionRightSize(solver_object.lp_,
                                   solver_object.solution_)) {
            highsLogUser(options.log_options, HighsLogType::kError,
                         "Inconsistent solution returned from solver\n");
            return HighsStatus::kError;
          }
        }  // options.run_crossover == kHighsOnString
           // clang-format off
      }  // unwelcome_ipx_status
      // clang-format on
    } else {
      // PDLP has been used, so check whether claim of optimality
      // satisfies the HiGHS criteria
      //
      // Even when PDLP terminates with primal and dual feasibility
      // and duality gap that are within the tolerances supplied by
      // HiGHS, the HiGHS primal and dual feasibility tolerances may
      // not be satisfied since they are absolute, and in PDLP they
      // are relative. Note that, even when only one PDLP row activity
      // fails to satisfy the absolute tolerance, the absolute norm
      // measure reported by PDLP will not necessarily be the same as
      // with HiGHS, since PDLP uses the 2-norm, and HiGHS the
      // infinity- and 1-norm
      //
      // A single small HiGHS primal infeasibility from PDLP can yield
      // a significant dual infeasibility, since the variable is
      // interpreted as being off its bound so any dual value is an
      // infeasibility. Hence, for context, the max and sum of
      // complementarity violations are also computed.
      const HighsInfo& info = solver_object.highs_info_;
      if (solver_object.model_status_ == HighsModelStatus::kOptimal) {
        if (info.num_primal_infeasibilities || info.num_dual_infeasibilities) {
          if (info.num_primal_infeasibilities) {
            highsLogUser(options.log_options, HighsLogType::kWarning,
                         "PDLP claims optimality, but with num/max/sum %d / "
                         "%9.4g / %9.4g primal infeasibilities\n",
                         int(info.num_primal_infeasibilities),
                         info.max_primal_infeasibility,
                         info.sum_primal_infeasibilities);
          } else if (info.num_dual_infeasibilities) {
            highsLogUser(options.log_options, HighsLogType::kWarning,
                         "PDLP claims optimality, but with num/max/sum %d / "
                         "%9.4g / %9.4g dual infeasibilities\n",
                         int(info.num_dual_infeasibilities),
                         info.max_dual_infeasibility,
                         info.sum_dual_infeasibilities);
          }
          highsLogUser(options.log_options, HighsLogType::kWarning,
                       "                        and          max/sum     %9.4g "
                       "/ %9.4g complementarity violations\n",
                       info.max_complementarity_violation,
                       info.sum_complementarity_violations);
          highsLogUser(
              options.log_options, HighsLogType::kWarning,
              "                        so set model status to \"unknown\"\n");
          solver_object.model_status_ = HighsModelStatus::kUnknown;
        }
      } else if (solver_object.model_status_ ==
                 HighsModelStatus::kUnboundedOrInfeasible) {
        if (info.num_primal_infeasibilities == 0)
          solver_object.model_status_ = HighsModelStatus::kUnbounded;
      }
    }
  } else {
    // Use Simplex
    call_status = solveLpSimplex(solver_object);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "solveLpSimplex");
    if (return_status == HighsStatus::kError) return return_status;
    if (!isSolutionRightSize(solver_object.lp_, solver_object.solution_)) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Inconsistent solution returned from solver\n");
      return HighsStatus::kError;
    }
  }
  // Analyse the HiGHS (basic) solution
  if (debugHighsLpSolution(message, solver_object) ==
      HighsDebugStatus::kLogicalError)
    return_status = HighsStatus::kError;
  return return_status;
}